

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O3

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,LogicalExpression *expression)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Value *pVVar8;
  VariableValue *pVVar9;
  PrimitiveSimpleObject *pPVar10;
  Type *pTVar11;
  _Alloc_hider _Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  bool bVar14;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  psVar1 = &expression->operation_;
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 == 0) {
    pVVar9 = (VariableValue *)operator_new(0x50);
    pPVar10 = (PrimitiveSimpleObject *)operator_new(0x18);
    pTVar11 = (Type *)operator_new(0x28);
    paVar13 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"boolean","");
    Type::Type(pTVar11,&local_50);
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar10,pTVar11);
    VariableValue::VariableValue(pVVar9,pPVar10,1);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar9;
    _Var12._M_p = local_50._M_dataplus._M_p;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 == 0) {
      pVVar9 = (VariableValue *)operator_new(0x50);
      pPVar10 = (PrimitiveSimpleObject *)operator_new(0x18);
      pTVar11 = (Type *)operator_new(0x28);
      paVar13 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"boolean","");
      Type::Type(pTVar11,&local_70);
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar10,pTVar11);
      VariableValue::VariableValue(pVVar9,pPVar10,0);
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar9;
      _Var12._M_p = local_70._M_dataplus._M_p;
    }
    else if (&expression->lhs_->super_Node == (Node *)0x0) {
      pVVar8 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
      iVar4 = (*pVVar8->_vptr_Value[2])(pVVar8);
      pVVar9 = (VariableValue *)operator_new(0x50);
      pPVar10 = (PrimitiveSimpleObject *)operator_new(0x18);
      pTVar11 = (Type *)operator_new(0x28);
      paVar13 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"boolean","");
      Type::Type(pTVar11,&local_90);
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar10,pTVar11);
      VariableValue::VariableValue(pVVar9,pPVar10,(uint)(iVar4 == 0));
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar9;
      _Var12._M_p = local_90._M_dataplus._M_p;
    }
    else {
      pVVar8 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,&expression->lhs_->super_Node);
      iVar4 = (*pVVar8->_vptr_Value[2])(pVVar8);
      pVVar8 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
      iVar5 = (*pVVar8->_vptr_Value[2])(pVVar8);
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      iVar7 = std::__cxx11::string::compare((char *)psVar1);
      bVar2 = iVar6 == 0 && (iVar5 != 0 && iVar4 != 0);
      if (iVar7 == 0) {
        bVar2 = iVar5 != 0 || iVar4 != 0;
      }
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      bVar14 = iVar4 == iVar5;
      bVar3 = iVar4 < iVar5;
      if (iVar6 != 0) {
        bVar3 = bVar2;
      }
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      bVar2 = iVar4 <= iVar5;
      if (iVar6 != 0) {
        bVar2 = bVar3;
      }
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      bVar3 = !bVar14 && iVar5 <= iVar4;
      if (iVar6 != 0) {
        bVar3 = bVar2;
      }
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      bVar2 = iVar5 <= iVar4;
      if (iVar6 != 0) {
        bVar2 = bVar3;
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      bVar3 = bVar14;
      if (iVar4 != 0) {
        bVar3 = bVar2;
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      bVar2 = !bVar14;
      if (iVar4 != 0) {
        bVar2 = bVar3;
      }
      pVVar9 = (VariableValue *)operator_new(0x50);
      pPVar10 = (PrimitiveSimpleObject *)operator_new(0x18);
      pTVar11 = (Type *)operator_new(0x28);
      paVar13 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"boolean","");
      Type::Type(pTVar11,&local_b0);
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar10,pTVar11);
      VariableValue::VariableValue(pVVar9,pPVar10,(uint)bVar2);
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar9;
      _Var12._M_p = local_b0._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p != paVar13) {
    operator_delete(_Var12._M_p,paVar13->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(LogicalExpression* expression) {
  if (expression->operation_ == "true") {
    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("boolean")), 1);
  } else if (expression->operation_ == "false") {
    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("boolean")), 0);
  } else if (expression->lhs_ == nullptr) {
    auto value = Accept(expression->rhs_)->GetValue();
    tos_value_ = new VariableValue(
        new PrimitiveSimpleObject(new Type("boolean")), !value);
  } else {
    auto lhs = Accept(expression->lhs_)->GetValue();
    auto rhs = Accept(expression->rhs_)->GetValue();
    bool result = false;
    if (expression->operation_ == "&&") {
      result = lhs && rhs;
    }
    if (expression->operation_ == "||") {
      result = lhs || rhs;
    }
    if (expression->operation_ == "<") {
      result = lhs < rhs;
    }
    if (expression->operation_ == "<=") {
      result = lhs <= rhs;
    }
    if (expression->operation_ == ">") {
      result = lhs > rhs;
    }
    if (expression->operation_ == ">=") {
      result = lhs >= rhs;
    }
    if (expression->operation_ == "==") {
      result = lhs == rhs;
    }
    if (expression->operation_ == "!=") {
      result = lhs != rhs;
    }

    tos_value_ = new VariableValue(
        new PrimitiveSimpleObject(new Type("boolean")), result);
  }
}